

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O2

void writeimage(void)

{
  int iVar1;
  unsigned_short *__ptr;
  unsigned_short *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int status;
  fitsfile *fptr;
  long naxes [2];
  char filename [13];
  long exposure;
  unsigned_short *array [200];
  
  builtin_strncpy(filename + 8,".fit",5);
  builtin_strncpy(filename,"atestfil",8);
  naxes[0] = 300;
  naxes[1] = 200;
  __ptr = (unsigned_short *)malloc(120000);
  puVar2 = __ptr;
  for (uVar4 = 1; puVar2 = puVar2 + 300, uVar4 < 200; uVar4 = uVar4 + 1) {
    array[uVar4] = puVar2;
  }
  array[0] = __ptr;
  remove(filename);
  status = 0;
  iVar1 = ffinit(&fptr,filename);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffcrim(fptr,0x14,2,naxes,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  lVar5 = 0;
  lVar3 = naxes[0];
  if (naxes[0] < 1) {
    lVar3 = lVar5;
  }
  lVar6 = 0;
  if (0 < naxes[1]) {
    lVar6 = naxes[1];
  }
  for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar3 != lVar7; lVar7 = lVar7 + 1) {
      array[lVar5][lVar7] = (short)lVar5 + (short)lVar7;
    }
  }
  iVar1 = ffppr(fptr,0x14,1,naxes[1] * naxes[0],__ptr,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  free(__ptr);
  exposure = 0x5dc;
  iVar1 = ffuky(fptr,0x29,"EXPOSURE",&exposure,"Total Exposure Time",&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  iVar1 = ffclos(fptr,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  return;
}

Assistant:

void writeimage( void )

    /******************************************************/
    /* Create a FITS primary array containing a 2-D image */
    /******************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status, ii, jj;
    long  fpixel, nelements, exposure;
    unsigned short *array[200];

    /* initialize FITS image parameters */
    char filename[] = "atestfil.fit";             /* name for new FITS file */
    int bitpix   =  USHORT_IMG; /* 16-bit unsigned short pixel values       */
    long naxis    =   2;  /* 2-dimensional image                            */    
    long naxes[2] = { 300, 200 };   /* image is 300 pixels wide by 200 rows */

    /* allocate memory for the whole image */ 
    array[0] = (unsigned short *)malloc( naxes[0] * naxes[1]
                                        * sizeof( unsigned short ) );

    /* initialize pointers to the start of each row of the image */
    for( ii=1; ii<naxes[1]; ii++ )
      array[ii] = array[ii-1] + naxes[0];

    remove(filename);               /* Delete old file if it already exists */

    status = 0;         /* initialize status before calling fitsio routines */

    if (fits_create_file(&fptr, filename, &status)) /* create new FITS file */
         printerror( status );           /* call printerror if error occurs */

    /* write the required keywords for the primary array image.     */
    /* Since bitpix = USHORT_IMG, this will cause cfitsio to create */
    /* a FITS image with BITPIX = 16 (signed short integers) with   */
    /* BSCALE = 1.0 and BZERO = 32768.  This is the convention that */
    /* FITS uses to store unsigned integers.  Note that the BSCALE  */
    /* and BZERO keywords will be automatically written by cfitsio  */
    /* in this case.                                                */

    if ( fits_create_img(fptr,  bitpix, naxis, naxes, &status) )
         printerror( status );          

    /* initialize the values in the image with a linear ramp function */
    for (jj = 0; jj < naxes[1]; jj++)
    {   for (ii = 0; ii < naxes[0]; ii++)
        {
            array[jj][ii] = ii + jj;
        }
    }

    fpixel = 1;                               /* first pixel to write      */
    nelements = naxes[0] * naxes[1];          /* number of pixels to write */

    /* write the array of unsigned integers to the FITS file */
    if ( fits_write_img(fptr, TUSHORT, fpixel, nelements, array[0], &status) )
        printerror( status );
      
    free( array[0] );  /* free previously allocated memory */

    /* write another optional keyword to the header */
    /* Note that the ADDRESS of the value is passed in the routine */
    exposure = 1500;
    if ( fits_update_key(fptr, TLONG, "EXPOSURE", &exposure,
         "Total Exposure Time", &status) )
         printerror( status );           

    if ( fits_close_file(fptr, &status) )                /* close the file */
         printerror( status );           

    return;
}